

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

int __thiscall
kj::UnixEventPort::poll(UnixEventPort *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  undefined7 extraout_var;
  Fault local_300;
  Fault f_6;
  SyscallResult local_2e0;
  undefined1 local_2dc [4];
  SyscallResult _kjSyscallResult_5;
  int n;
  epoll_event events [16];
  Fault f_5;
  SyscallResult local_1fc;
  SyscallResult _kjSyscallResult_4;
  Fault f_4;
  undefined1 local_1e8 [8];
  DebugComparison<int_&,_int_&> _kjCondition;
  Fault f_3;
  SyscallResult local_198;
  undefined1 local_194 [4];
  SyscallResult _kjSyscallResult_3;
  int n_1;
  siginfo_t siginfo;
  timespec timeout;
  Fault f_2;
  SyscallResult local_f0 [2];
  SyscallResult _kjSyscallResult_2;
  Fault f_1;
  SyscallResult local_cc;
  SignalPromiseAdapter *pSStack_c8;
  SyscallResult _kjSyscallResult_1;
  SignalPromiseAdapter *ptr;
  uint count;
  Fault local_b0;
  Fault f;
  SyscallResult local_9c;
  undefined1 local_98 [4];
  SyscallResult _kjSyscallResult;
  sigset_t sigset;
  UnixEventPort *this_local;
  
  this->sleeping = false;
  if ((this->signalHead != (SignalPromiseAdapter *)0x0) ||
     (bVar1 = Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::operator==
                        (&this->childSet), ((bVar1 ^ 0xffU) & 1) != 0)) {
    f.exception = (Exception *)local_98;
    local_9c = kj::_::Debug::syscall<kj::UnixEventPort::poll()::__0>
                         ((anon_class_8_1_6b59732f *)&f,false);
    pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_9c);
    if (pvVar3 == (void *)0x0) {
      iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_9c);
      kj::_::Debug::Fault::Fault
                (&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x2af,iVar2,"sigemptyset(&sigset)","");
      kj::_::Debug::Fault::fatal(&local_b0);
    }
    ptr._0_4_ = 0;
    for (pSStack_c8 = this->signalHead; pSStack_c8 != (SignalPromiseAdapter *)0x0;
        pSStack_c8 = pSStack_c8->next) {
      f_1.exception = (Exception *)local_98;
      local_cc = kj::_::Debug::syscall<kj::UnixEventPort::poll()::__1>
                           ((anon_class_16_2_ba631ce8 *)&f_1,false);
      pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_cc);
      if (pvVar3 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_cc);
        kj::_::Debug::Fault::Fault
                  ((Fault *)&_kjSyscallResult_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2b5,iVar2,"sigaddset(&sigset, ptr->signum)","");
        kj::_::Debug::Fault::fatal((Fault *)&_kjSyscallResult_2);
      }
      ptr._0_4_ = (int)ptr + 1;
    }
    bVar1 = Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::operator==
                      (&this->childSet);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      f_2.exception = (Exception *)local_98;
      local_f0[0] = kj::_::Debug::syscall<kj::UnixEventPort::poll()::__2>
                              ((anon_class_8_1_6b59732f *)&f_2,false);
      pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_f0);
      if (pvVar3 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(local_f0);
        kj::_::Debug::Fault::Fault
                  ((Fault *)&timeout.tv_nsec,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2ba,iVar2,"sigaddset(&sigset, SIGCHLD)","");
        kj::_::Debug::Fault::fatal((Fault *)&timeout.tv_nsec);
      }
      ptr._0_4_ = (int)ptr + 1;
    }
    for (; (int)ptr != 0; ptr._0_4_ = (int)ptr + -1) {
      timeout.tv_sec = 0;
      f_3.exception = (Exception *)local_194;
      local_198 = kj::_::Debug::syscall<kj::UnixEventPort::poll()::__3>
                            ((anon_class_32_4_814b4d84 *)&f_3,true);
      pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_198);
      if (pvVar3 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_198);
        kj::_::Debug::Fault::Fault
                  ((Fault *)&_kjCondition.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2c7,iVar2,"n = sigtimedwait(&sigset, &siginfo, &timeout)","");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition.result);
      }
      if ((int)local_194 < 0) break;
      f_4.exception =
           (Exception *)
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)local_194);
      kj::_::DebugExpression<int&>::operator==
                ((DebugComparison<int_&,_int_&> *)local_1e8,(DebugExpression<int&> *)&f_4,
                 &_kjSyscallResult_3.errorNumber);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
      if (!bVar1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int&>&>
                  ((Fault *)&stack0xfffffffffffffe08,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2ca,FAILED,"n == siginfo.si_signo","_kjCondition,",
                   (DebugComparison<int_&,_int_&> *)local_1e8);
        kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe08);
      }
      gotSignal(this,(siginfo_t *)&_kjSyscallResult_3);
      f_5.exception = (Exception *)local_98;
      local_1fc = kj::_::Debug::syscall<kj::UnixEventPort::poll()::__4>
                            ((anon_class_16_2_5478a8a8 *)&f_5,false);
      pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1fc);
      if (pvVar3 == (void *)0x0) {
        iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_1fc);
        kj::_::Debug::Fault::Fault
                  ((Fault *)&events[0xf].data,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2cf,iVar2,"sigdelset(&sigset, n)","");
        kj::_::Debug::Fault::fatal((Fault *)&events[0xf].data);
      }
    }
  }
  f_6.exception = (Exception *)local_2dc;
  local_2e0 = kj::_::Debug::syscall<kj::UnixEventPort::poll()::__5>
                        ((anon_class_24_3_f26d5bf2 *)&f_6,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_2e0);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_2e0);
    kj::_::Debug::Fault::Fault
              (&local_300,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x2d6,iVar2,"n = epoll_wait(epollFd, events, kj::size(events), 0)","");
    kj::_::Debug::Fault::fatal(&local_300);
  }
  bVar1 = processEpollEvents(this,(epoll_event *)&_kjSyscallResult_5,(int)local_2dc);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool UnixEventPort::poll() {
  // Unfortunately, epoll_pwait() with a timeout of zero will never deliver actually deliver any
  // pending signals. Therefore, we need a completely different approach to poll for signals. We
  // might as well use regular epoll_wait() in this case, too, to save the kernel some effort.

  sleeping = false;

  if (signalHead != nullptr || childSet != kj::none) {
    // Use sigtimedwait() to poll for signals.

    // Construct a sigset of all signals we are interested in.
    sigset_t sigset;
    KJ_SYSCALL(sigemptyset(&sigset));
    uint count = 0;

    {
      auto ptr = signalHead;
      while (ptr != nullptr) {
        KJ_SYSCALL(sigaddset(&sigset, ptr->signum));
        ++count;
        ptr = ptr->next;
      }
      if (childSet != kj::none) {
        KJ_SYSCALL(sigaddset(&sigset, SIGCHLD));
        ++count;
      }
    }

    // While that set is non-empty, poll for signals.
    while (count > 0) {
      struct timespec timeout;
      timeout.tv_sec = 0;
      timeout.tv_nsec = 0;

      siginfo_t siginfo;
      int n;
      KJ_NONBLOCKING_SYSCALL(n = sigtimedwait(&sigset, &siginfo, &timeout));
      if (n < 0) break;  // EAGAIN: no signals in set are raised

      KJ_ASSERT(n == siginfo.si_signo);
      gotSignal(siginfo);

      // Remove that signal from the set so we don't receive it again, but keep checking for others
      // if there are any.
      KJ_SYSCALL(sigdelset(&sigset, n));
      --count;
    }
  }

  struct epoll_event events[16];
  int n;
  KJ_SYSCALL(n = epoll_wait(epollFd, events, kj::size(events), 0));

  return processEpollEvents(events, n);
}